

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

void __thiscall alex::LinearModelBuilder<int>::build(LinearModelBuilder<int> *this)

{
  double dVar1;
  longdouble lVar2;
  int iVar3;
  longdouble lVar4;
  double intercept;
  double slope;
  LinearModelBuilder<int> *this_local;
  
  if (this->count_ < 2) {
    this->model_->a_ = 0.0;
    this->model_->b_ = (double)this->y_sum_;
  }
  else {
    lVar4 = (longdouble)this->count_ * this->xx_sum_ - this->x_sum_ * this->x_sum_;
    if ((lVar4 != (longdouble)0) || (NAN(lVar4) || NAN((longdouble)0))) {
      lVar4 = this->x_sum_;
      dVar1 = (double)((this->xy_sum_ * (longdouble)this->count_ - this->y_sum_ * lVar4) /
                      ((longdouble)this->count_ * this->xx_sum_ - lVar4 * lVar4));
      lVar4 = this->y_sum_;
      lVar2 = this->x_sum_;
      iVar3 = this->count_;
      this->model_->a_ = dVar1;
      this->model_->b_ = (double)((lVar4 - lVar2 * (longdouble)dVar1) / (longdouble)iVar3);
      if (this->model_->a_ <= 0.0) {
        if (this->x_max_ == this->x_min_) {
          this->model_->a_ = 0.0;
          this->model_->b_ = (double)this->y_sum_ / (double)this->count_;
        }
        else {
          this->model_->a_ = (this->y_max_ - this->y_min_) / (double)(this->x_max_ - this->x_min_);
          this->model_->b_ = -(double)this->x_min_ * this->model_->a_;
        }
      }
    }
    else {
      this->model_->a_ = 0.0;
      this->model_->b_ = (double)this->y_sum_ / (double)this->count_;
    }
  }
  return;
}

Assistant:

void build() {
    if (count_ <= 1) {
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_);
      return;
    }

    if (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_ == 0) {
      // all values in a bucket have the same key.
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_) / count_;
      return;
    }

    auto slope = static_cast<double>(
        (static_cast<long double>(count_) * xy_sum_ - x_sum_ * y_sum_) /
        (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_));
    auto intercept = static_cast<double>(
        (y_sum_ - static_cast<long double>(slope) * x_sum_) / count_);
    model_->a_ = slope;
    model_->b_ = intercept;

    // If floating point precision errors, fit spline
    if (model_->a_ <= 0) {
      if (x_max_ - x_min_ == 0){
        model_->a_ = 0;
        model_->b_ = static_cast<double>(y_sum_) / count_;
      }
      else{
        model_->a_ = (y_max_ - y_min_) / (x_max_ - x_min_);
        model_->b_ = -static_cast<double>(x_min_) * model_->a_;
      }
    }
  }